

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzrot::ChNodeFEAxyzrot(ChNodeFEAxyzrot *this,ChNodeFEAxyzrot *other)

{
  ChQuaternion<double> local_38;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x2b8);
  this->super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_00b2c638;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb54b08;
  *(undefined8 *)&this->field_0x2b8 = 0xb54c08;
  (this->super_ChNodeFEAbase).m_TotalMass = (other->super_ChNodeFEAbase).m_TotalMass;
  (this->super_ChNodeFEAbase).g_index = (other->super_ChNodeFEAbase).g_index;
  ChFrameMoving<double>::ChFrameMoving
            ((ChFrameMoving<double> *)&(this->super_ChNodeFEAbase).field_0x18,
             (ChFrameMoving<double> *)&(other->super_ChNodeFEAbase).field_0x18);
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb54618;
  *(undefined8 *)&this->field_0x2b8 = 0xb549f8;
  *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x18 = 0xb54788;
  (this->super_ChVariableTupleCarrier_1vars<6>)._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x228);
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb548b0;
  ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&this->variables);
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  (this->X0)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->X0).coord.pos.m_data[0] = 0.0;
  (this->X0).coord.pos.m_data[1] = 0.0;
  (this->X0).coord.pos.m_data[2] = 0.0;
  (this->X0).coord.rot.m_data[0] = 1.0;
  (this->X0).coord.rot.m_data[1] = 0.0;
  (this->X0).coord.rot.m_data[2] = 0.0;
  (this->X0).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->X0).Amatrix,&local_38);
  (this->Force).m_data[2] = 0.0;
  (this->Torque).m_data[0] = 0.0;
  (this->Torque).m_data[1] = 0.0;
  (this->Torque).m_data[2] = 0.0;
  (this->Force).m_data[0] = 0.0;
  (this->Force).m_data[1] = 0.0;
  (this->Force).m_data[2] = 0.0;
  (this->Torque).m_data[0] = 0.0;
  ChFrame<double>::operator=(&this->X0,&other->X0);
  if (other != this) {
    (this->Force).m_data[0] = (other->Force).m_data[0];
    (this->Force).m_data[1] = (other->Force).m_data[1];
    (this->Force).m_data[2] = (other->Force).m_data[2];
    (this->Torque).m_data[0] = (other->Torque).m_data[0];
    (this->Torque).m_data[1] = (other->Torque).m_data[1];
    (this->Torque).m_data[2] = (other->Torque).m_data[2];
  }
  ChVariablesBodyOwnMass::operator=(&this->variables,&other->variables);
  return;
}

Assistant:

ChNodeFEAxyzrot::ChNodeFEAxyzrot(const ChNodeFEAxyzrot& other) : ChNodeFEAbase(other), ChBodyFrame(other) {
    X0 = other.X0;

    Force = other.Force;
    Torque = other.Torque;

    variables = other.variables;
}